

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<short>,ImPlot::GetterXsYRef<short>,ImPlot::TransformerLinLin>
               (GetterXsYs<short> *getter1,GetterXsYRef<short> *getter2,
               TransformerLinLin *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  ImPlotContext *pIVar1;
  bool bVar2;
  int idx;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ImPlotPoint IVar8;
  ImVec2 p1;
  ImVec2 p2;
  ImVec2 local_68;
  ImVec2 local_60;
  LineSegmentsRenderer<ImPlot::GetterXsYs<short>,_ImPlot::GetterXsYRef<short>,_ImPlot::TransformerLinLin>
  local_58;
  
  pIVar1 = GImPlot;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_58.Prims = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_58.Prims = getter1->Count;
    }
    local_58.Getter1 = getter1;
    local_58.Getter2 = getter2;
    local_58.Transformer = transformer;
    local_58.Col = col;
    local_58.Weight = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<short>,ImPlot::GetterXsYRef<short>,ImPlot::TransformerLinLin>>
              (&local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    iVar3 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      iVar3 = getter1->Count;
    }
    idx = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != idx; idx = idx + 1) {
      IVar8 = GetterXsYs<short>::operator()(getter1,idx);
      local_58.Getter1 = (GetterXsYs<short> *)IVar8.x;
      local_58.Getter2 = (GetterXsYRef<short> *)IVar8.y;
      local_68 = TransformerLinLin::operator()(transformer,(ImPlotPoint *)&local_58);
      IVar8 = GetterXsYRef<short>::operator()(getter2,idx);
      local_58.Getter1 = (GetterXsYs<short> *)IVar8.x;
      local_58.Getter2 = (GetterXsYRef<short> *)IVar8.y;
      local_60 = TransformerLinLin::operator()(transformer,(ImPlotPoint *)&local_58);
      auVar6._8_8_ = 0;
      auVar6._0_4_ = local_68.x;
      auVar6._4_4_ = local_68.y;
      auVar7._8_4_ = extraout_XMM0_Dc;
      auVar7._0_4_ = local_60.x;
      auVar7._4_4_ = local_60.y;
      auVar7._12_4_ = extraout_XMM0_Dd;
      auVar7 = minps(auVar6,auVar7);
      uVar4 = -(uint)(local_60.x <= local_68.x);
      uVar5 = -(uint)(local_60.y <= local_68.y);
      local_58.Getter2 =
           (GetterXsYRef<short> *)
           (CONCAT44(~uVar5 & (uint)local_60.y,~uVar4 & (uint)local_60.x) |
           CONCAT44((uint)local_68.y & uVar5,(uint)local_68.x & uVar4));
      local_58.Getter1 = auVar7._0_8_;
      bVar2 = ImRect::Overlaps(&pIVar1->CurrentPlot->PlotRect,(ImRect *)&local_58);
      if (bVar2) {
        ImDrawList::AddLine(DrawList,&local_68,&local_60,col,line_weight);
      }
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}